

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O3

GenericDatum * __thiscall avro::Node::defaultValueAt(Node *this,int index)

{
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  int local_11c;
  put_holder<char,_std::char_traits<char>_> local_118;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  local_11c = index;
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,"No default value at: %1%");
  local_118.arg = &local_11c;
  local_118.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,int>;
  local_118.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,int>;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_100,&local_118);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

virtual const GenericDatum& defaultValueAt(int index) {
        throw Exception(boost::format("No default value at: %1%") % index);
    }